

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::ColumnChunk::~ColumnChunk(ColumnChunk *this)

{
  ~ColumnChunk(this,&VTT);
  return;
}

Assistant:

ColumnChunk::~ColumnChunk() noexcept {
}